

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshba.cpp
# Opt level: O2

int select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,timeval *__timeout)

{
  pointer pHVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  int iVar5;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  while( true ) {
    iVar2 = getKey();
    pHVar1 = hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((iVar2 == 0xd) || (iVar2 == 10)) break;
    iVar5 = -1;
    if ((iVar2 != config.upKey) && (iVar5 = 1, iVar2 != config.downKey)) goto LAB_0010406f;
    iVar2 = (int)(((long)hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x68);
    currentIndex = ((iVar5 + currentIndex) % iVar2 + iVar2) % iVar2;
    display();
  }
  lVar3 = (long)currentIndex;
  std::operator+(&local_40,"ssh ",
                 &hosts.super__Vector_base<Host,_std::allocator<Host>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar3].userName);
  std::operator+(&local_c0,&local_40,"@");
  std::operator+(&local_a0,&local_c0,&pHVar1[lVar3].address);
  std::operator+(&local_80,&local_a0," -p");
  std::__cxx11::to_string(&local_e0,pHVar1[lVar3].port);
  std::operator+(&cmd,&local_80,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<(poVar4,"> ");
  poVar4 = std::operator<<(poVar4,(string *)&cmd);
  std::endl<char,std::char_traits<char>>(poVar4);
  system(cmd._M_dataplus._M_p);
LAB_0010406f:
  exit(0);
}

Assistant:

void select() {
    int key;
    while (true) {
        key = getKey();
        if (key == '\n' || key == '\r') {
            const auto &x = hosts[currentIndex];
            std::string cmd = "ssh " + x.userName + "@" + x.address + " -p" + std::to_string(x.port);
            std::cout << std::endl << "> " << cmd << std::endl;
            system(cmd.c_str());
            exit(0);
        } else if (key == config.upKey) {
            currentIndex = (currentIndex - 1) % int(hosts.size());
        } else if (key == config.downKey) {
            currentIndex = (currentIndex + 1) % int(hosts.size());
        } else {
            exit(0);
        }
        currentIndex = (currentIndex + int(hosts.size())) % int(hosts.size());
        display();
    }
}